

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_reader.cpp
# Opt level: O0

void __thiscall diffusion::Tokenizer::~Tokenizer(Tokenizer *this)

{
  Tokenizer *this_local;
  
  std::
  deque<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::~deque(&this->processed_data_queue_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

void push(std::string const & raw_data) {
        unprocessed_data_ += raw_data;
        auto message_length = *reinterpret_cast<Size *>(&unprocessed_data_[0]);
        unprocessed_data_.erase(0, sizeof(Size));
        if (message_length < 0)
            throw ErrorDataCorruption();
        if (static_cast<std::size_t>(message_length) > unprocessed_data_.size()) {
        } else {
            std::lock_guard<std::mutex> lock(queue_mutex_);
            processed_data_queue_.push_back(to_vector_char(&unprocessed_data_[0], message_length));
            unprocessed_data_.erase(0, message_length);
        }
    }